

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

string * __thiscall
slang::SVInt::toString_abi_cxx11_
          (string *__return_storage_ptr__,SVInt *this,LiteralBase base,bool includeBase,
          bitwidth_t abbreviateThresholdBits)

{
  EVP_PKEY_CTX *ctx;
  SmallVector<char,_40UL> buffer;
  SmallVectorBase<char> local_48 [2];
  
  local_48[0].data_ = local_48[0].firstElement;
  local_48[0].len = 0;
  local_48[0].cap = 0x28;
  writeTo(this,local_48,base,includeBase,abbreviateThresholdBits);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ctx = (EVP_PKEY_CTX *)local_48[0].data_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_48[0].data_,
             (EVP_PKEY_CTX *)(local_48[0].data_ + local_48[0].len));
  SmallVectorBase<char>::cleanup(local_48,ctx);
  return __return_storage_ptr__;
}

Assistant:

std::string SVInt::toString(LiteralBase base, bool includeBase,
                            bitwidth_t abbreviateThresholdBits) const {
    SmallVector<char> buffer;
    writeTo(buffer, base, includeBase, abbreviateThresholdBits);
    return std::string(buffer.begin(), buffer.end());
}